

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O3

ArrowTypeExtension * __thiscall
duckdb::DBConfig::GetArrowExtension
          (ArrowTypeExtension *__return_storage_ptr__,DBConfig *this,LogicalType *type)

{
  undefined1 *puVar1;
  ArrowExtensionMetadata *pAVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  pointer pAVar4;
  mapped_type *pmVar5;
  pointer pAVar6;
  reference pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  *this_00;
  TypeInfo type_info;
  TypeInfo local_148;
  ArrowExtensionMetadata local_120;
  ArrowExtensionMetadata local_a0;
  
  this_00 = &this->arrow_extensions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(this_00);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    TypeInfo::TypeInfo(&local_148,type);
    pAVar4 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pmVar5 = ::std::__detail::
             _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pAVar4->type_to_info,&local_148);
    if ((pmVar5->
        super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ).
        super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pmVar5->
        super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ).
        super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_148.type = ANY;
      pAVar4 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_00);
      pAVar6 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_00);
      pmVar5 = ::std::__detail::
               _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pAVar6->type_to_info,&local_148);
      pvVar7 = vector<duckdb::ArrowExtensionMetadata,_true>::front(pmVar5);
      ArrowExtensionMetadata::ArrowExtensionMetadata(&local_120,pvVar7);
      GetArrowExtensionInternal(__return_storage_ptr__,&pAVar4->type_extensions,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.arrow_format._M_dataplus._M_p != &local_120.arrow_format.field_2) {
        operator_delete(local_120.arrow_format._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.type_name._M_dataplus._M_p != &local_120.type_name.field_2) {
        operator_delete(local_120.type_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.vendor_name._M_dataplus._M_p != &local_120.vendor_name.field_2) {
        operator_delete(local_120.vendor_name._M_dataplus._M_p);
      }
      pAVar2 = &local_120;
    }
    else {
      pAVar4 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_00);
      pAVar6 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_00);
      pmVar5 = ::std::__detail::
               _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pAVar6->type_to_info,&local_148);
      pvVar7 = vector<duckdb::ArrowExtensionMetadata,_true>::front(pmVar5);
      ArrowExtensionMetadata::ArrowExtensionMetadata(&local_a0,pvVar7);
      GetArrowExtensionInternal(__return_storage_ptr__,&pAVar4->type_extensions,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.arrow_format._M_dataplus._M_p != &local_a0.arrow_format.field_2) {
        operator_delete(local_a0.arrow_format._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.type_name._M_dataplus._M_p != &local_a0.type_name.field_2) {
        operator_delete(local_a0.type_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.vendor_name._M_dataplus._M_p != &local_a0.vendor_name.field_2) {
        operator_delete(local_a0.vendor_name._M_dataplus._M_p);
      }
      pAVar2 = &local_a0;
    }
    paVar8 = &(pAVar2->extension_name).field_2;
    puVar1 = *(undefined1 **)(paVar8->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != paVar8) {
      operator_delete(puVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.alias._M_dataplus._M_p != &local_148.alias.field_2) {
      operator_delete(local_148.alias._M_dataplus._M_p);
    }
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

ArrowTypeExtension DBConfig::GetArrowExtension(const LogicalType &type) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	TypeInfo type_info(type);
	if (!arrow_extensions->type_to_info[type_info].empty()) {
		return GetArrowExtensionInternal(arrow_extensions->type_extensions,
		                                 arrow_extensions->type_to_info[type_info].front());
	}
	type_info.type = LogicalTypeId::ANY;
	return GetArrowExtensionInternal(arrow_extensions->type_extensions,
	                                 arrow_extensions->type_to_info[type_info].front());
}